

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O0

void die(int statusPipe,char *message)

{
  size_t sVar1;
  int res;
  size_t msgLen;
  char *message_local;
  int statusPipe_local;
  
  sVar1 = strlen(message);
  printf("Process launch failed: %s\n",message);
  write(statusPipe,message,sVar1 + 1);
  exit(-1);
}

Assistant:

static void die (int statusPipe, const char* message)
{
	size_t	msgLen	= strlen(message);
	int		res		= 0;

	printf("Process launch failed: %s\n", message);
	res = (int)write(statusPipe, message, msgLen+1);
	DE_UNREF(res); /* No need to check result. */
	exit(-1);
}